

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserFastaTest_CompressedParseWholeWithoutTrimming_Test::TestBody
          (BioparserFastaTest_CompressedParseWholeWithoutTrimming_Test *this)

{
  Parser<biosoup::Sequence> *pPVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"sample.fasta.gz",&local_31);
  BioparserFastaTest::Setup(&this->super_BioparserFastaTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pPVar1 = (this->super_BioparserFastaTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&local_30,pPVar1,0xffffffffffffffff,0);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::_M_move_assign(&(this->super_BioparserFastaTest).s);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
             *)&local_30);
  BioparserFastaTest::Check(&this->super_BioparserFastaTest,false);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, CompressedParseWholeWithoutTrimming) {
  Setup("sample.fasta.gz");
  s = p->Parse(-1, false);
  Check(false);
}